

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# locid.cpp
# Opt level: O1

int __thiscall icu_63::Locale::init(Locale *this,EVP_PKEY_CTX *ctx)

{
  byte *__s;
  int iVar1;
  Locale *other;
  char *pcVar2;
  char *pcVar3;
  char *pcVar4;
  char in_DL;
  ulong uVar5;
  byte *pbVar6;
  byte *__s_00;
  size_t __n;
  UErrorCode err;
  int32_t fieldLen [5];
  char *field [5];
  UErrorCode local_7c;
  int local_78 [8];
  byte *local_58;
  byte *apbStack_50 [4];
  
  this->fIsBogus = '\0';
  if (this->baseName != this->fullName) {
    uprv_free_63(this->baseName);
  }
  this->baseName = (char *)0x0;
  pcVar3 = this->fullNameBuffer;
  if (this->fullName != pcVar3) {
    uprv_free_63(this->fullName);
    this->fullName = pcVar3;
  }
  apbStack_50[1] = (byte *)0x0;
  apbStack_50[2] = (byte *)0x0;
  local_58 = (byte *)0x0;
  apbStack_50[0] = (byte *)0x0;
  apbStack_50[3] = (byte *)0x0;
  local_78[0] = 0;
  local_78[1] = 0;
  local_78[2] = 0;
  local_78[3] = 0;
  local_78[4] = 0;
  if (ctx == (EVP_PKEY_CTX *)0x0) {
    other = getDefault();
    operator=(this,other);
    goto LAB_0028d9a4;
  }
  this->country[0] = '\0';
  this->script[0] = '\0';
  this->language[0] = '\0';
  local_7c = U_ZERO_ERROR;
  if (in_DL == '\0') {
    iVar1 = uloc_getName_63((char *)ctx,this->fullName,0x9d,&local_7c);
  }
  else {
    iVar1 = uloc_canonicalize_63((char *)ctx,this->fullName,0x9d,&local_7c);
  }
  if (iVar1 < 0x9d && local_7c != U_BUFFER_OVERFLOW_ERROR) {
LAB_0028d805:
    if (local_7c != U_STRING_NOT_TERMINATED_WARNING && local_7c < U_ILLEGAL_ARGUMENT_ERROR) {
      this->variantBegin = iVar1;
      __s = (byte *)this->fullName;
      local_58 = __s;
      pcVar3 = strchr((char *)__s,0x5f);
      uVar5 = 0;
      pbVar6 = __s;
      do {
        __s_00 = pbVar6;
        if (pcVar3 == (char *)0x0) break;
        __s_00 = (byte *)(pcVar3 + 1);
        apbStack_50[uVar5] = __s_00;
        local_78[uVar5] = (int)pcVar3 - (int)pbVar6;
        uVar5 = uVar5 + 1;
        pcVar3 = strchr((char *)__s_00,0x5f);
        pbVar6 = __s_00;
      } while (uVar5 < 3);
      pcVar3 = strchr((char *)__s_00,0x40);
      pcVar2 = strchr((char *)__s_00,0x2e);
      if (pcVar3 == (char *)0x0 && pcVar2 == (char *)0x0) {
        iVar1 = iVar1 + ((int)__s - (int)__s_00);
      }
      else {
        pcVar4 = pcVar3;
        if (pcVar2 < pcVar3) {
          pcVar4 = pcVar2;
        }
        if (pcVar2 == (char *)0x0) {
          pcVar4 = pcVar3;
        }
        iVar1 = (int)pcVar4;
        if (pcVar3 == (char *)0x0) {
          iVar1 = (int)pcVar2;
        }
        iVar1 = iVar1 - (int)__s_00;
      }
      local_78[uVar5] = iVar1;
      __n = (size_t)local_78[0];
      if ((long)__n < 0xc) {
        if (0 < local_78[0]) {
          memcpy(this->language,__s,__n);
          this->language[__n] = '\0';
        }
        uVar5 = 1;
        if ((((local_78[1] == 4) && ((byte)((*apbStack_50[0] & 0xdf) + 0xbf) < 0x1a)) &&
            ((byte)((apbStack_50[0][1] & 0xdf) + 0xbf) < 0x1a)) &&
           (((byte)((apbStack_50[0][2] & 0xdf) + 0xbf) < 0x1a &&
            ((byte)((apbStack_50[0][3] & 0xdf) + 0xbf) < 0x1a)))) {
          memcpy(this->script,apbStack_50[0],4);
          this->script[4] = '\0';
          uVar5 = 2;
        }
        iVar1 = local_78[uVar5];
        if (iVar1 - 2U < 2) {
          memcpy(this->country,apbStack_50[uVar5 - 1],(long)iVar1);
          this->country[iVar1] = '\0';
LAB_0028d96a:
          uVar5 = (ulong)((int)uVar5 + 1);
        }
        else if (iVar1 == 0) goto LAB_0028d96a;
        if (0 < local_78[uVar5]) {
          this->variantBegin = *(int *)(apbStack_50 + (uVar5 - 1)) - *(int *)&this->fullName;
        }
        local_7c = U_ZERO_ERROR;
        initBaseName(this,&local_7c);
        if (local_7c < U_ILLEGAL_ARGUMENT_ERROR) goto LAB_0028d9a4;
      }
    }
  }
  else {
    iVar1 = iVar1 + 1;
    pcVar2 = (char *)uprv_malloc_63((long)iVar1);
    this->fullName = pcVar2;
    if (pcVar2 != (char *)0x0) {
      local_7c = U_ZERO_ERROR;
      if (in_DL == '\0') {
        iVar1 = uloc_getName_63((char *)ctx,pcVar2,iVar1,&local_7c);
      }
      else {
        iVar1 = uloc_canonicalize_63((char *)ctx,pcVar2,iVar1,&local_7c);
      }
      goto LAB_0028d805;
    }
    this->fullName = pcVar3;
  }
  setToBogus(this);
LAB_0028d9a4:
  return (int)this;
}

Assistant:

Locale& Locale::init(const char* localeID, UBool canonicalize)
{
    fIsBogus = FALSE;
    /* Free our current storage */
    if (baseName != fullName) {
        uprv_free(baseName);
    }
    baseName = NULL;
    if(fullName != fullNameBuffer) {
        uprv_free(fullName);
        fullName = fullNameBuffer;
    }

    // not a loop:
    // just an easy way to have a common error-exit
    // without goto and without another function
    do {
        char *separator;
        char *field[5] = {0};
        int32_t fieldLen[5] = {0};
        int32_t fieldIdx;
        int32_t variantField;
        int32_t length;
        UErrorCode err;

        if(localeID == NULL) {
            // not an error, just set the default locale
            return *this = getDefault();
        }

        /* preset all fields to empty */
        language[0] = script[0] = country[0] = 0;

        // "canonicalize" the locale ID to ICU/Java format
        err = U_ZERO_ERROR;
        length = canonicalize ?
            uloc_canonicalize(localeID, fullName, sizeof(fullNameBuffer), &err) :
            uloc_getName(localeID, fullName, sizeof(fullNameBuffer), &err);

        if(err == U_BUFFER_OVERFLOW_ERROR || length >= (int32_t)sizeof(fullNameBuffer)) {
            /*Go to heap for the fullName if necessary*/
            fullName = (char *)uprv_malloc(sizeof(char)*(length + 1));
            if(fullName == 0) {
                fullName = fullNameBuffer;
                break; // error: out of memory
            }
            err = U_ZERO_ERROR;
            length = canonicalize ?
                uloc_canonicalize(localeID, fullName, length+1, &err) :
                uloc_getName(localeID, fullName, length+1, &err);
        }
        if(U_FAILURE(err) || err == U_STRING_NOT_TERMINATED_WARNING) {
            /* should never occur */
            break;
        }

        variantBegin = length;

        /* after uloc_getName/canonicalize() we know that only '_' are separators */
        separator = field[0] = fullName;
        fieldIdx = 1;
        while ((separator = uprv_strchr(field[fieldIdx-1], SEP_CHAR)) != 0 && fieldIdx < UPRV_LENGTHOF(field)-1) {
            field[fieldIdx] = separator + 1;
            fieldLen[fieldIdx-1] = (int32_t)(separator - field[fieldIdx-1]);
            fieldIdx++;
        }
        // variant may contain @foo or .foo POSIX cruft; remove it
        separator = uprv_strchr(field[fieldIdx-1], '@');
        char* sep2 = uprv_strchr(field[fieldIdx-1], '.');
        if (separator!=NULL || sep2!=NULL) {
            if (separator==NULL || (sep2!=NULL && separator > sep2)) {
                separator = sep2;
            }
            fieldLen[fieldIdx-1] = (int32_t)(separator - field[fieldIdx-1]);
        } else {
            fieldLen[fieldIdx-1] = length - (int32_t)(field[fieldIdx-1] - fullName);
        }

        if (fieldLen[0] >= (int32_t)(sizeof(language)))
        {
            break; // error: the language field is too long
        }

        variantField = 1; /* Usually the 2nd one, except when a script or country is also used. */
        if (fieldLen[0] > 0) {
            /* We have a language */
            uprv_memcpy(language, fullName, fieldLen[0]);
            language[fieldLen[0]] = 0;
        }
        if (fieldLen[1] == 4 && ISASCIIALPHA(field[1][0]) &&
                ISASCIIALPHA(field[1][1]) && ISASCIIALPHA(field[1][2]) &&
                ISASCIIALPHA(field[1][3])) {
            /* We have at least a script */
            uprv_memcpy(script, field[1], fieldLen[1]);
            script[fieldLen[1]] = 0;
            variantField++;
        }

        if (fieldLen[variantField] == 2 || fieldLen[variantField] == 3) {
            /* We have a country */
            uprv_memcpy(country, field[variantField], fieldLen[variantField]);
            country[fieldLen[variantField]] = 0;
            variantField++;
        } else if (fieldLen[variantField] == 0) {
            variantField++; /* script or country empty but variant in next field (i.e. en__POSIX) */
        }

        if (fieldLen[variantField] > 0) {
            /* We have a variant */
            variantBegin = (int32_t)(field[variantField] - fullName);
        }

        err = U_ZERO_ERROR;
        initBaseName(err);
        if (U_FAILURE(err)) {
            break;
        }

        // successful end of init()
        return *this;
    } while(0); /*loop doesn't iterate*/

    // when an error occurs, then set this object to "bogus" (there is no UErrorCode here)
    setToBogus();

    return *this;
}